

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O2

void __thiscall Potassco::SmodelsInput::SymTab::~SymTab(SymTab *this)

{
  (this->super_AtomTable)._vptr_AtomTable = (_func_int **)&PTR__SymTab_001ebc38;
  std::__cxx11::string::~string((string *)&this->temp);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->atoms)._M_h);
  return;
}

Assistant:

SymTab(AbstractProgram& o) : out(&o) {}